

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_dispel_evil(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  undefined4 in_R8D;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  CHAR_DATA *in_stack_00000008;
  int dam;
  CHAR_DATA *victim;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  CHAR_DATA *ch_00;
  undefined4 in_stack_ffffffffffffffe0;
  CHAR_DATA *pCVar2;
  
  pCVar2 = in_RCX;
  bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  ch_00 = in_RCX;
  if ((!bVar1) &&
     (bVar1 = is_evil((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)),
     ch_00 = in_RDX, !bVar1)) {
    ch_00 = in_RCX;
  }
  bVar1 = is_good((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (bVar1) {
    act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),ch_00,
        (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
        (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  }
  else {
    bVar1 = is_neutral((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (bVar1) {
      act((char *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),ch_00,
          (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
          (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    }
    else {
      dice(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      saves_spell((int)victim,in_stack_00000008,unaff_retaddr_00);
      damage_old((CHAR_DATA *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                 (CHAR_DATA *)CONCAT44(in_EDI,in_ESI),(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
                 (int)((ulong)pCVar2 >> 0x20),SUB81((ulong)pCVar2 >> 0x18,0));
    }
  }
  return;
}

Assistant:

void spell_dispel_evil(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam;

	if (!is_npc(ch) && is_evil(ch))
		victim = ch;

	if (is_good(victim))
	{
		act("$N is protected.", ch, nullptr, victim, TO_ROOM);
		return;
	}

	if (is_neutral(victim))
	{
		act("$N does not seem to be affected.", ch, nullptr, victim, TO_CHAR);
		return;
	}

	dam = dice(level, 4);

	if (saves_spell(level, victim, DAM_HOLY))
		dam /= 2;

	damage_old(ch, victim, dam, sn, DAM_HOLY, true);
}